

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ArrowButtonEx(char *str_id,ImGuiDir dir,ImVec2 size,ImGuiButtonFlags flags)

{
  ImGuiWindow *this;
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  ImGuiID id;
  ImU32 fill_col;
  ImGuiCol idx;
  float fVar4;
  ImVec2 IVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool hovered;
  bool held;
  ImRect bb;
  bool local_52;
  bool local_51;
  ImVec2 local_50;
  ImU32 local_48;
  ImGuiDir local_44;
  ImRect local_40;
  
  pIVar1 = GImGui;
  auVar9._8_56_ = in_register_00001208;
  auVar9._0_8_ = size;
  local_50 = (ImVec2)vmovlps_avx(auVar9._0_16_);
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    id = ImGuiWindow::GetID(this,str_id,(char *)0x0);
    IVar5 = (this->DC).CursorPos;
    auVar6._8_8_ = 0;
    auVar6._0_4_ = IVar5.x;
    auVar6._4_4_ = IVar5.y;
    auVar10._0_4_ = IVar5.x + local_50.x;
    auVar10._4_4_ = IVar5.y + local_50.y;
    auVar10._8_8_ = 0;
    local_40 = (ImRect)vmovlhps_avx(auVar6,auVar10);
    fVar4 = GetFrameHeight();
    if (fVar4 <= local_50.y) {
      fVar4 = (pIVar1->Style).FramePadding.y;
    }
    else {
      fVar4 = -1.0;
    }
    ItemSize(&local_50,fVar4);
    bVar3 = false;
    bVar2 = ItemAdd(&local_40,id,(ImRect *)0x0);
    if (bVar2) {
      local_44 = dir;
      bVar3 = ButtonBehavior(&local_40,id,&local_52,&local_51,
                             ((this->DC).ItemFlags & 2U) << 9 | flags);
      if ((local_51 != true) || (idx = 0x17, local_52 == false)) {
        idx = local_52 + 0x15;
      }
      fill_col = GetColorU32(idx,1.0);
      local_48 = GetColorU32(0,1.0);
      RenderNavHighlight(&local_40,id,1);
      RenderFrame(local_40.Min,local_40.Max,fill_col,true,(pIVar1->Style).FrameRounding);
      auVar7._8_8_ = 0;
      auVar7._0_4_ = local_50.x;
      auVar7._4_4_ = local_50.y;
      fVar4 = pIVar1->FontSize;
      auVar11._4_4_ = fVar4;
      auVar11._0_4_ = fVar4;
      auVar11._8_4_ = fVar4;
      auVar11._12_4_ = fVar4;
      auVar6 = vsubps_avx(auVar7,auVar11);
      auVar8._0_4_ = auVar6._0_4_ * 0.5;
      auVar8._4_4_ = auVar6._4_4_ * 0.5;
      auVar8._8_4_ = auVar6._8_4_ * 0.5;
      auVar8._12_4_ = auVar6._12_4_ * 0.5;
      auVar6 = vcmpps_avx(auVar8,ZEXT816(0) << 0x20,6);
      auVar6 = vandps_avx(auVar6,auVar8);
      IVar5.x = local_40.Min.x + auVar6._0_4_;
      IVar5.y = local_40.Min.y + auVar6._4_4_;
      RenderArrow(this->DrawList,IVar5,local_48,local_44,1.0);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::ArrowButtonEx(const char* str_id, ImGuiDir dir, ImVec2 size, ImGuiButtonFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiID id = window->GetID(str_id);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    const float default_size = GetFrameHeight();
    ItemSize(size, (size.y >= default_size) ? g.Style.FramePadding.y : -1.0f);
    if (!ItemAdd(bb, id))
        return false;

    if (window->DC.ItemFlags & ImGuiItemFlags_ButtonRepeat)
        flags |= ImGuiButtonFlags_Repeat;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    // Render
    const ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    const ImU32 text_col = GetColorU32(ImGuiCol_Text);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, bg_col, true, g.Style.FrameRounding);
    RenderArrow(window->DrawList, bb.Min + ImVec2(ImMax(0.0f, (size.x - g.FontSize) * 0.5f), ImMax(0.0f, (size.y - g.FontSize) * 0.5f)), text_col, dir);

    return pressed;
}